

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lax_der_privatekey_parsing.c
# Opt level: O0

int ec_privkey_import_der(secp256k1_context *ctx,uchar *out32,uchar *privkey,size_t privkeylen)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uchar *seckey;
  long in_RCX;
  char *in_RDX;
  secp256k1_context *in_RSI;
  int len;
  int lenb;
  uchar *end;
  uint local_40;
  int local_4;
  
  pcVar4 = in_RDX + in_RCX;
  memset(in_RSI,0,0x20);
  if ((pcVar4 < in_RDX + 1) || (*in_RDX != '0')) {
    local_4 = 0;
  }
  else if ((pcVar4 < in_RDX + 2) || ((in_RDX[1] & 0x80U) == 0)) {
    local_4 = 0;
  }
  else {
    bVar1 = in_RDX[1];
    uVar2 = bVar1 & 0xffffff7f;
    if (((bVar1 & 0x7f) == 0) || (2 < uVar2)) {
      local_4 = 0;
    }
    else if (pcVar4 < in_RDX + (long)(int)uVar2 + 2) {
      local_4 = 0;
    }
    else {
      if (uVar2 < 2) {
        local_40 = 0;
      }
      else {
        local_40 = (uint)(byte)in_RDX[(long)(int)(uVar2 - 2) + 2] << 8;
      }
      pcVar5 = in_RDX + (long)(int)uVar2 + 2;
      if (pcVar4 < pcVar5 + (int)((byte)in_RDX[(long)(int)(uVar2 - 1) + 2] | local_40)) {
        local_4 = 0;
      }
      else if ((((pcVar4 < pcVar5 + 3) || (*pcVar5 != '\x02')) || (pcVar5[1] != '\x01')) ||
              (pcVar5[2] != '\x01')) {
        local_4 = 0;
      }
      else {
        seckey = (uchar *)(pcVar5 + 3);
        if (((pcVar4 < pcVar5 + 5) || (*seckey != '\x04')) ||
           ((0x20 < (byte)pcVar5[4] || (pcVar4 < pcVar5 + (long)(int)(uint)(byte)pcVar5[4] + 5)))) {
          local_4 = 0;
        }
        else {
          if (pcVar5[4] != '\0') {
            memcpy((void *)((long)in_RSI + (0x20 - (long)(int)(uint)(byte)pcVar5[4])),pcVar5 + 5,
                   (ulong)(byte)pcVar5[4]);
          }
          iVar3 = secp256k1_ec_seckey_verify(in_RSI,seckey);
          if (iVar3 == 0) {
            memset(in_RSI,0,0x20);
            local_4 = 0;
          }
          else {
            local_4 = 1;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ec_privkey_import_der(const secp256k1_context* ctx, unsigned char *out32, const unsigned char *privkey, size_t privkeylen) {
    const unsigned char *end = privkey + privkeylen;
    int lenb = 0;
    int len = 0;
    memset(out32, 0, 32);
    /* sequence header */
    if (end < privkey+1 || *privkey != 0x30) {
        return 0;
    }
    privkey++;
    /* sequence length constructor */
    if (end < privkey+1 || !(*privkey & 0x80)) {
        return 0;
    }
    lenb = *privkey & ~0x80; privkey++;
    if (lenb < 1 || lenb > 2) {
        return 0;
    }
    if (end < privkey+lenb) {
        return 0;
    }
    /* sequence length */
    len = privkey[lenb-1] | (lenb > 1 ? privkey[lenb-2] << 8 : 0);
    privkey += lenb;
    if (end < privkey+len) {
        return 0;
    }
    /* sequence element 0: version number (=1) */
    if (end < privkey+3 || privkey[0] != 0x02 || privkey[1] != 0x01 || privkey[2] != 0x01) {
        return 0;
    }
    privkey += 3;
    /* sequence element 1: octet string, up to 32 bytes */
    if (end < privkey+2 || privkey[0] != 0x04 || privkey[1] > 0x20 || end < privkey+2+privkey[1]) {
        return 0;
    }
    if (privkey[1]) memcpy(out32 + 32 - privkey[1], privkey + 2, privkey[1]);
    if (!secp256k1_ec_seckey_verify(ctx, out32)) {
        memset(out32, 0, 32);
        return 0;
    }
    return 1;
}